

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O2

IterateResult __thiscall
glcts::GeometryShaderInvalidArrayedInputVariablesTest::iterate
          (GeometryShaderInvalidArrayedInputVariablesTest *this)

{
  ostringstream *this_00;
  ostringstream *this_01;
  GLenum gs_input_primitive_type;
  long lVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  NotSupportedError *this_02;
  char *pcVar5;
  bool *pbVar6;
  long lVar7;
  bool bVar8;
  bool has_vs_compiled;
  bool has_gs_compiled;
  bool has_fs_compiled;
  uint local_1e0;
  GLint link_status;
  long local_1d8;
  string local_1d0;
  undefined1 local_1b0 [384];
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1d8 = CONCAT44(extraout_var,iVar2);
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == true) {
    this_00 = (ostringstream *)(local_1b0 + 8);
    local_1e0 = (uint)CONCAT71((int7)((ulong)local_1d8 >> 8),1);
    for (lVar7 = 0; lVar7 != 0x14; lVar7 = lVar7 + 4) {
      gs_input_primitive_type = *(GLenum *)((long)&DAT_0179b4f0 + lVar7);
      deinitSOs(this);
      has_fs_compiled = false;
      has_gs_compiled = false;
      has_vs_compiled = false;
      initShaderObjects(this,gs_input_primitive_type,&has_fs_compiled,&has_gs_compiled,
                        &has_vs_compiled);
      lVar1 = local_1d8;
      bVar8 = has_fs_compiled;
      if (((has_fs_compiled == true) && (has_gs_compiled == true)) && (has_vs_compiled != false)) {
        GVar3 = (**(code **)(local_1d8 + 0x3c8))();
        this->m_po_id = GVar3;
        dVar4 = (**(code **)(lVar1 + 0x800))();
        glu::checkError(dVar4,"glCreateProgram() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                        ,0x343);
        (**(code **)(lVar1 + 0x10))(this->m_po_id,this->m_fs_id);
        (**(code **)(lVar1 + 0x10))(this->m_po_id,this->m_gs_id);
        (**(code **)(lVar1 + 0x10))(this->m_po_id,this->m_vs_id);
        dVar4 = (**(code **)(lVar1 + 0x800))();
        glu::checkError(dVar4,"glAttachShader() call(s) failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                        ,0x349);
        (**(code **)(lVar1 + 0xce8))(this->m_po_id);
        dVar4 = (**(code **)(lVar1 + 0x800))();
        glu::checkError(dVar4,"glLinkProgram() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                        ,0x34d);
        link_status = 0;
        (**(code **)(lVar1 + 0x9d8))(this->m_po_id,0x8b82,&link_status);
        dVar4 = (**(code **)(lVar1 + 0x800))();
        glu::checkError(dVar4,"glGetProgramiv() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                        ,0x353);
        this_01 = (ostringstream *)(local_1b0 + 8);
        if (link_status == 1) {
          local_1b0._0_8_ =
               ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream(this_01);
          std::operator<<((ostream *)this_01,"A PO using a malformed GS has linked successfully. ");
          pcVar5 = "Test input primitive type: ";
          std::operator<<((ostream *)this_01,"Test input primitive type: ");
          getInputPrimitiveTypeQualifier_abi_cxx11_
                    (&local_1d0,(GeometryShaderInvalidArrayedInputVariablesTest *)pcVar5,
                     gs_input_primitive_type);
          std::operator<<((ostream *)this_01,(string *)&local_1d0);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::ostringstream::~ostringstream(this_01);
          local_1e0 = 0;
        }
      }
      else {
        local_1b0._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::operator<<((ostream *)this_00,
                        "One of the shaders failed to compile (but shouldn\'t have). Shaders that failed to compile:"
                       );
        pcVar5 = "FS ";
        if (bVar8 != false) {
          pcVar5 = fixed_sample_locations_values + 1;
        }
        std::operator<<((ostream *)this_00,pcVar5);
        pcVar5 = "GS ";
        if (has_gs_compiled != false) {
          pcVar5 = fixed_sample_locations_values + 1;
        }
        std::operator<<((ostream *)this_00,pcVar5);
        pbVar6 = (bool *)0x16c0965;
        if (has_vs_compiled != false) {
          pbVar6 = fixed_sample_locations_values + 1;
        }
        std::operator<<((ostream *)this_00,pbVar6);
        pcVar5 = ". Input primitive type: [";
        std::operator<<((ostream *)this_00,". Input primitive type: [");
        getInputPrimitiveTypeQualifier_abi_cxx11_
                  (&local_1d0,(GeometryShaderInvalidArrayedInputVariablesTest *)pcVar5,
                   gs_input_primitive_type);
        std::operator<<((ostream *)this_00,(string *)&local_1d0);
        std::operator<<((ostream *)this_00,"]");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::ostringstream::~ostringstream(this_00);
      }
    }
    bVar8 = (local_1e0 & 1) == 0;
    if (bVar8) {
      pcVar5 = "Fail";
    }
    else {
      pcVar5 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar8,pcVar5
              );
    return STOP;
  }
  this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_02,"Geometry shader functionality not supported, skipping",
             fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
             ,0x31e);
  __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderInvalidArrayedInputVariablesTest::iterate()
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Iterate over all valid input primitive types */
	const glw::GLenum input_primitive_types[] = { GL_POINTS, GL_LINES, GL_LINES_ADJACENCY, GL_TRIANGLES,
												  GL_TRIANGLES_ADJACENCY };
	const unsigned int n_input_primitive_types = sizeof(input_primitive_types) / sizeof(input_primitive_types[0]);

	for (unsigned int n_input_primitive_type = 0; n_input_primitive_type < n_input_primitive_types;
		 ++n_input_primitive_type)
	{
		const glw::GLenum input_primitive_type = input_primitive_types[n_input_primitive_type];

		/* Release shader objects initialized in previous iterations */
		deinitSOs();

		/* Set up shader objects */
		bool has_fs_compiled = false;
		bool has_gs_compiled = false;
		bool has_vs_compiled = false;

		initShaderObjects(input_primitive_type, &has_fs_compiled, &has_gs_compiled, &has_vs_compiled);

		if (!has_fs_compiled || !has_gs_compiled || !has_vs_compiled)
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "One of the shaders failed to compile (but shouldn't have). Shaders that failed to compile:"
				<< ((!has_fs_compiled) ? "FS " : "") << ((!has_gs_compiled) ? "GS " : "")
				<< ((!has_vs_compiled) ? "VS" : "") << ". Input primitive type: ["
				<< getInputPrimitiveTypeQualifier(input_primitive_type) << "]" << tcu::TestLog::EndMessage;

			continue;
		}

		/* Set up a program object */
		m_po_id = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed");

		gl.attachShader(m_po_id, m_fs_id);
		gl.attachShader(m_po_id, m_gs_id);
		gl.attachShader(m_po_id, m_vs_id);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call(s) failed");

		/* Try to link the PO */
		gl.linkProgram(m_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

		/* Verify the link status */
		glw::GLint link_status = GL_FALSE;

		gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed");

		if (link_status == GL_TRUE)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "A PO using a malformed GS has linked successfully. "
							   << "Test input primitive type: " << getInputPrimitiveTypeQualifier(input_primitive_type)
							   << tcu::TestLog::EndMessage;

			result = false;
		}
	} /* for (all input primitive types) */

	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}